

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O1

int Abc_Tt8Isop(word *uOn,word *uOnDc,int nVars,word *uRes)

{
  int iVar1;
  word wVar2;
  word *pwVar3;
  int nCubes;
  word uRes0 [2];
  word uOnDc2 [2];
  word uRes2 [2];
  word uRes1 [2];
  word uOn2 [2];
  word uOn1 [2];
  word uOn0 [2];
  int local_c4;
  word *local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  word *local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  word *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  
  local_c4 = 0;
  if (nVars < 7) {
    wVar2 = Abc_Tt6Isop(*uOn,*uOnDc,nVars,&local_c4);
    uRes[3] = wVar2;
    uRes[2] = wVar2;
    uRes[1] = wVar2;
    *uRes = wVar2;
  }
  else {
    pwVar3 = uRes;
    if (nVars != 7) {
      if ((((*uOn != uOn[2]) || (uOn[1] != uOn[3])) || (*uOnDc != uOnDc[2])) ||
         (pwVar3 = (word *)uOnDc[1], pwVar3 != (word *)uOnDc[3])) {
        if (nVars != 8) {
          __assert_fail("nVars == 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0x746,"int Abc_Tt8Isop(word *, word *, int, word *)");
        }
        local_48 = *uOn & ~uOnDc[2];
        local_40 = ~uOnDc[3] & uOn[1];
        pwVar3 = (word *)(uOnDc[2] & *uOnDc);
        local_58 = uOn[2] & ~*uOnDc;
        local_50 = ~uOnDc[1] & uOn[3];
        local_90 = uOnDc[1] & uOnDc[3];
        local_98 = pwVar3;
        iVar1 = Abc_Tt7Isop(&local_48,uOnDc,(int)&local_a8,pwVar3);
        local_c4 = local_c4 + iVar1;
        local_c0 = uOnDc + 2;
        iVar1 = Abc_Tt7Isop(&local_58,uOnDc + 2,(int)&local_78,pwVar3);
        local_c4 = local_c4 + iVar1;
        local_b0 = local_78;
        local_b8 = local_70;
        local_68 = ~local_78 & uOn[2] | ~local_a8 & *uOn;
        local_60 = (word *)(~local_70 & uOn[3] | ~local_a0 & uOn[1]);
        iVar1 = Abc_Tt7Isop(&local_68,(word *)&local_98,(int)&local_88,local_60);
        local_c4 = local_c4 + iVar1;
        local_a8 = local_a8 | local_88;
        *uRes = local_a8;
        local_a0 = local_a0 | local_80;
        uRes[1] = local_a0;
        local_88 = local_88 | local_b0;
        uRes[2] = local_88;
        local_80 = local_80 | local_b8;
        uRes[3] = local_80;
        if ((((*uOn & ~local_a8) == 0) && ((uOn[1] & ~local_a0) == 0)) &&
           (((uOn[2] & ~local_88) == 0 && ((uOn[3] & ~local_80) == 0)))) {
          if ((((local_a8 & ~*uOnDc) == 0) && ((local_a0 & ~uOnDc[1]) == 0)) &&
             (((local_88 & ~*local_c0) == 0 && ((local_80 & ~uOnDc[3]) == 0)))) {
            return local_c4;
          }
          __assert_fail("(uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 && (uRes[2] & ~uOnDc[2])==0 && (uRes[3] & ~uOnDc[3])==0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0x75a,"int Abc_Tt8Isop(word *, word *, int, word *)");
        }
        __assert_fail("(uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 && (uOn[2] & ~uRes[2]) == 0 && (uOn[3] & ~uRes[3]) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                      ,0x759,"int Abc_Tt8Isop(word *, word *, int, word *)");
      }
    }
    local_c4 = Abc_Tt7Isop(uOn,uOnDc,(int)uRes,pwVar3);
    uRes[2] = *uRes;
    uRes[3] = uRes[1];
  }
  return local_c4;
}

Assistant:

static inline int Abc_Tt8Isop( word uOn[4], word uOnDc[4], int nVars, word uRes[4] )
{
    int nCubes = 0;
    if ( nVars <= 6 )
        uRes[0] = uRes[1] = uRes[2] = uRes[3] = Abc_Tt6Isop( uOn[0], uOnDc[0], nVars, &nCubes );
    else if ( nVars == 7 || (uOn[0] == uOn[2] && uOn[1] == uOn[3] && uOnDc[0] == uOnDc[2] && uOnDc[1] == uOnDc[3]) )
    {
        nCubes = Abc_Tt7Isop( uOn, uOnDc, 7, uRes );
        uRes[2] = uRes[0];
        uRes[3] = uRes[1];
    }
    else 
    {
        word uOn0[2], uOn1[2], uOn2[2], uOnDc2[2], uRes0[2], uRes1[2], uRes2[2];
        assert( nVars == 8 );
        // cofactor
        uOn0[0] = uOn[0] & ~uOnDc[2];
        uOn0[1] = uOn[1] & ~uOnDc[3];
        uOn1[0] = uOn[2] & ~uOnDc[0];
        uOn1[1] = uOn[3] & ~uOnDc[1];
        uOnDc2[0] = uOnDc[0] & uOnDc[2];
        uOnDc2[1] = uOnDc[1] & uOnDc[3];
        // solve for cofactors
        nCubes += Abc_Tt7Isop( uOn0, uOnDc+0, 7, uRes0 );
        nCubes += Abc_Tt7Isop( uOn1, uOnDc+2, 7, uRes1 );
        uOn2[0] = (uOn[0] & ~uRes0[0]) | (uOn[2] & ~uRes1[0]);
        uOn2[1] = (uOn[1] & ~uRes0[1]) | (uOn[3] & ~uRes1[1]);
        nCubes += Abc_Tt7Isop( uOn2, uOnDc2, 7, uRes2 );
        // derive the final truth table
        uRes[0] = uRes2[0] | uRes0[0];
        uRes[1] = uRes2[1] | uRes0[1];
        uRes[2] = uRes2[0] | uRes1[0];
        uRes[3] = uRes2[1] | uRes1[1];
        assert( (uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 && (uOn[2] & ~uRes[2]) == 0 && (uOn[3] & ~uRes[3]) == 0 );
        assert( (uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 && (uRes[2] & ~uOnDc[2])==0 && (uRes[3] & ~uOnDc[3])==0 );
    }
    return nCubes;
}